

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef *message)

{
  pointer pIVar1;
  TestCaseInfo *_testInfo;
  TestRunStats *this_00;
  TestRunInfo *_runInfo;
  StringRef *in_RSI;
  long in_RDI;
  Totals deltaTotals;
  TestCaseInfo *testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionResult result;
  AssertionResultData tempResult;
  TestCaseStats *in_stack_fffffffffffffaf0;
  AssertionResult *this_01;
  SourceLineInfo *in_stack_fffffffffffffaf8;
  RunContext *in_stack_fffffffffffffb00;
  SectionInfo *in_stack_fffffffffffffb08;
  TestCaseInfo *pTVar2;
  AssertionResult *in_stack_fffffffffffffb10;
  string *_stdErr;
  undefined8 in_stack_fffffffffffffb18;
  OfType _resultType;
  string *_stdOut;
  AssertionResultData *in_stack_fffffffffffffb20;
  Totals *_totals;
  StringRef *in_stack_fffffffffffffb28;
  TestCaseStats *this_02;
  undefined1 local_488 [56];
  size_t in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  Totals *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  RunContext *in_stack_fffffffffffffbd0;
  string local_420 [32];
  string local_400 [8];
  AssertionResult *in_stack_fffffffffffffc08;
  RunContext *in_stack_fffffffffffffc10;
  string local_3e0;
  undefined1 local_3c0 [304];
  string local_290;
  undefined8 local_268;
  TestCaseInfo *local_258;
  undefined1 local_250 [128];
  undefined1 local_1d0 [304];
  LazyExpression local_a0;
  string local_90 [104];
  StringRef local_28;
  undefined1 _aborting;
  
  _resultType = (OfType)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x127d55);
  StringRef::StringRef(&local_28,in_RSI);
  (*pIVar1->_vptr_IStreamingReporter[0x11])();
  StringRef::~StringRef((StringRef *)in_stack_fffffffffffffaf0);
  LazyExpression::LazyExpression(&local_a0,false);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffb20,_resultType,(LazyExpression *)in_stack_fffffffffffffb10);
  StringRef::operator_cast_to_string(in_stack_fffffffffffffb28);
  std::__cxx11::string::operator=(local_90,(string *)(local_1d0 + 0x110));
  std::__cxx11::string::~string((string *)(local_1d0 + 0x110));
  AssertionResult::AssertionResult
            (in_stack_fffffffffffffb10,(AssertionInfo *)in_stack_fffffffffffffb08,
             (AssertionResultData *)in_stack_fffffffffffffb00);
  assertionEnded(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  handleUnfinishedSections(in_stack_fffffffffffffb00);
  local_1d0._104_8_ = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  SectionInfo::SectionInfo
            ((SectionInfo *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             (string *)in_stack_fffffffffffffaf0);
  this_02 = (TestCaseStats *)local_1d0;
  Counts::Counts((Counts *)this_02);
  local_1d0._8_8_ = 1;
  SectionStats::SectionStats
            ((SectionStats *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (Counts *)in_stack_fffffffffffffb00,(double)in_stack_fffffffffffffaf8,
             SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0));
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x127edd);
  (*pIVar1->_vptr_IStreamingReporter[0xc])(pIVar1,local_250);
  _testInfo = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  _stdErr = &local_290;
  local_258 = _testInfo;
  Totals::Totals((Totals *)in_stack_fffffffffffffaf0);
  local_268 = 1;
  local_290.field_2._M_allocated_capacity = 1;
  this_00 = (TestRunStats *)
            clara::std::
            unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
            operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)0x127f50);
  _stdOut = &local_3e0;
  pTVar2 = local_258;
  std::__cxx11::string::string((string *)_stdOut);
  _aborting = (undefined1)((ulong)pTVar2 >> 0x38);
  _totals = (Totals *)local_400;
  std::__cxx11::string::string((string *)_totals);
  TestCaseStats::TestCaseStats(this_02,_testInfo,_totals,_stdOut,_stdErr,(bool)_aborting);
  (*this_00->_vptr_TestRunStats[0xd])(this_00,local_3c0);
  TestCaseStats::~TestCaseStats(in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  _runInfo = (TestRunInfo *)(in_RDI + 0x100);
  *(long *)(in_RDI + 0x128) = *(long *)(in_RDI + 0x128) + 1;
  this_01 = (AssertionResult *)local_420;
  std::__cxx11::string::string((string *)this_01);
  testGroupEnded(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_420);
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x12805f);
  TestRunStats::TestRunStats(this_00,_runInfo,(Totals *)this_01,SUB81((ulong)pIVar1 >> 0x38,0));
  (*pIVar1->_vptr_IStreamingReporter[0xf])(pIVar1,local_488);
  TestRunStats::~TestRunStats((TestRunStats *)0x1280ab);
  SectionStats::~SectionStats((SectionStats *)0x1280b8);
  SectionInfo::~SectionInfo((SectionInfo *)this_01);
  AssertionResult::~AssertionResult(this_01);
  AssertionResultData::~AssertionResultData((AssertionResultData *)this_01);
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = message;
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }